

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O3

uint * Kit_TruthIsop_rec(uint *puOn,uint *puOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint nVars_00;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  Kit_Sop_t cRes2;
  Kit_Sop_t local_60;
  Kit_Sop_t local_50;
  Kit_Sop_t local_40;
  
  uVar13 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar13 = 1;
  }
  lVar14 = (long)vStore->nSize;
  iVar3 = (int)((ulong)uVar13 + lVar14);
  vStore->nSize = iVar3;
  iVar16 = vStore->nCap;
  if (iVar16 < iVar3) {
LAB_005e0d4c:
    pcRes->nCubes = -1;
  }
  else {
    piVar18 = vStore->pArray;
    uVar12 = (ulong)uVar13;
    puVar4 = (uint *)(piVar18 + (((ulong)uVar13 + lVar14) - uVar12));
    uVar11 = uVar12;
    do {
      if ((long)uVar11 < 1) {
        pcRes->nLits = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = (uint *)0x0;
        iVar16 = 0;
        goto LAB_005e0f5c;
      }
      lVar10 = uVar11 - 1;
      uVar11 = uVar11 - 1;
      uVar17 = uVar12;
    } while (puOn[lVar10] == 0);
    do {
      if ((long)uVar17 < 1) {
        pcRes->nLits = 0;
        pcRes->nCubes = 1;
        vStore->nSize = iVar3 + 1;
        if (iVar3 < iVar16) {
          pcRes->pCubes = (uint *)(piVar18 + (long)(iVar3 + 1) + -1);
          piVar18[(long)(iVar3 + 1) + -1] = 0;
          iVar16 = 0xff;
LAB_005e0f5c:
          puVar4 = (uint *)memset(puVar4,iVar16,(ulong)(uVar13 - 1) * 4 + 4);
          return puVar4;
        }
        pcRes->pCubes = (uint *)0x0;
        goto LAB_005e0d4c;
      }
      lVar10 = uVar17 - 1;
      uVar17 = uVar17 - 1;
    } while (puOnDc[lVar10] == 0xffffffff);
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x107,
                    "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    iVar16 = nVars * 2;
    uVar15 = nVars;
    do {
      nVars_00 = uVar15;
      iVar16 = iVar16 + -2;
      if ((int)nVars_00 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                      ,0x10d,
                      "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      uVar15 = nVars_00 - 1;
      iVar3 = Kit_TruthVarInSupport(puOn,nVars,uVar15);
    } while ((iVar3 == 0) && (iVar3 = Kit_TruthVarInSupport(puOnDc,nVars,uVar15), iVar3 == 0));
    if (nVars_00 < 6) {
      uVar15 = Kit_TruthIsop5_rec(*puOn,*puOnDc,nVars_00,pcRes,vStore);
      auVar2 = _DAT_0094e250;
      lVar10 = uVar12 - 1;
      auVar19._8_4_ = (int)lVar10;
      auVar19._0_8_ = lVar10;
      auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar19 = auVar19 ^ _DAT_0094e250;
      auVar20 = _DAT_0094f530;
      auVar21 = _DAT_0094e240;
      do {
        auVar22 = auVar21 ^ auVar2;
        iVar16 = auVar19._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar16 && auVar19._0_4_ < auVar22._0_4_ ||
                    iVar16 < auVar22._4_4_) & 1)) {
          piVar18[lVar14 + uVar11] = uVar15;
        }
        if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
            auVar22._12_4_ <= auVar19._12_4_) {
          piVar18[lVar14 + uVar11 + 1] = uVar15;
        }
        auVar22 = auVar20 ^ auVar2;
        iVar3 = auVar22._4_4_;
        if (iVar3 <= iVar16 && (iVar3 != iVar16 || auVar22._0_4_ <= auVar19._0_4_)) {
          piVar18[lVar14 + uVar11 + 2] = uVar15;
          piVar18[lVar14 + uVar11 + 3] = uVar15;
        }
        uVar11 = uVar11 + 4;
        lVar10 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar10 + 4;
        lVar10 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar10 + 4;
      } while ((uVar13 + 3 & 0xfffffffc) != uVar11);
      return puVar4;
    }
    bVar9 = (char)nVars_00 - 6;
    uVar12 = (ulong)(uint)(1 << (bVar9 & 0x1f));
    uVar11 = uVar12 + 1;
    puVar5 = puOnDc + uVar12 * 2 + -1;
    do {
      puVar4[uVar11 - 2] = ~*puVar5 & puOn[uVar11 - 2];
      uVar11 = uVar11 - 1;
      puVar5 = puVar5 + -1;
    } while (1 < uVar11);
    puVar5 = Kit_TruthIsop_rec(puVar4,puOnDc,uVar15,&local_50,vStore);
    uVar11 = (ulong)(uint)local_50.nCubes;
    if (uVar11 != 0xffffffff) {
      uVar17 = uVar12 + 1;
      puVar7 = (uint *)(piVar18 + uVar12 * 2 + lVar14 + -1);
      lVar10 = 0;
      do {
        puVar7[lVar10] = ~puOnDc[uVar12 + lVar10 + -1] & puOn[uVar12 * 2 + lVar10 + -1];
        lVar1 = uVar17 + lVar10;
        lVar10 = lVar10 + -1;
      } while (1 < lVar1 - 1U);
      puVar6 = Kit_TruthIsop_rec(puVar4 + uVar12,puOnDc + uVar12,uVar15,&local_60,vStore);
      if ((ulong)(uint)local_60.nCubes != 0xffffffff) {
        do {
          puVar4[uVar17 - 2] = ~puVar5[uVar17 - 2] & puOn[uVar17 - 2];
          uVar17 = uVar17 - 1;
        } while (1 < uVar17);
        uVar17 = uVar12 + 1;
        lVar10 = 0;
        do {
          puVar7[lVar10] = ~puVar6[uVar12 + lVar10 + -1] & puOn[uVar12 * 2 + lVar10 + -1];
          lVar1 = uVar17 + lVar10;
          lVar10 = lVar10 + -1;
        } while (1 < lVar1 - 1U);
        do {
          puVar4[uVar17 - 2] = puVar4[uVar17 - 2] | *puVar7;
          uVar17 = uVar17 - 1;
          puVar7 = puVar7 + -1;
        } while (1 < uVar17);
        uVar17 = uVar12 + 1;
        lVar10 = uVar12 * 8;
        do {
          lVar10 = lVar10 + -4;
          *(uint *)((long)puVar4 + lVar10) = *(uint *)((long)puOnDc + lVar10) & puOnDc[uVar17 - 2];
          uVar17 = uVar17 - 1;
        } while (1 < uVar17);
        puVar7 = Kit_TruthIsop_rec(puVar4,puVar4 + uVar12,uVar15,&local_40,vStore);
        if ((ulong)(uint)local_40.nCubes != 0xffffffff) {
          pcRes->nLits = local_50.nLits + local_60.nCubes + local_50.nCubes + local_60.nLits +
                         local_40.nLits;
          iVar3 = local_40.nCubes + local_60.nCubes + local_50.nCubes;
          pcRes->nCubes = iVar3;
          puVar8 = Vec_IntFetch(vStore,iVar3);
          pcRes->pCubes = puVar8;
          if (puVar8 == (uint *)0x0) {
            pcRes->nCubes = -1;
            return (uint *)0x0;
          }
          if (local_50.nCubes < 1) {
            uVar11 = 0;
          }
          else {
            uVar17 = 0;
            do {
              puVar8[uVar17] = local_50.pCubes[uVar17] | 1 << ((byte)iVar16 & 0x1f);
              uVar17 = uVar17 + 1;
            } while (uVar11 != uVar17);
          }
          if (0 < local_60.nCubes) {
            uVar17 = 0;
            do {
              puVar8[uVar11 + uVar17] = local_60.pCubes[uVar17] | 2 << ((byte)iVar16 & 0x1f);
              uVar17 = uVar17 + 1;
            } while ((uint)local_60.nCubes != uVar17);
            uVar11 = (ulong)(uint)((int)uVar11 + (int)uVar17);
          }
          iVar16 = (int)uVar11;
          if (0 < local_40.nCubes) {
            uVar17 = 0;
            do {
              puVar8[uVar11 + uVar17] = local_40.pCubes[uVar17];
              uVar17 = uVar17 + 1;
            } while ((uint)local_40.nCubes != uVar17);
            iVar16 = iVar16 + (int)uVar17;
          }
          if (iVar16 != pcRes->nCubes) {
            __assert_fail("k == pcRes->nCubes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0x145,
                          "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                         );
          }
          uVar11 = uVar12 + 1;
          do {
            puVar4[uVar11 - 2] = puVar7[uVar11 - 2] | puVar5[uVar11 - 2];
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
          uVar11 = uVar12 + 1;
          puVar5 = (uint *)(piVar18 + uVar12 * 2 + lVar14);
          do {
            puVar5 = puVar5 + -1;
            *puVar5 = puVar7[uVar11 - 2] | puVar6[uVar11 - 2];
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
          uVar13 = uVar13 >> ((char)nVars_00 - 5U & 0x1f);
          if (1 < uVar13) {
            uVar15 = 2 << (bVar9 & 0x1f);
            uVar11 = (ulong)uVar15;
            piVar18 = piVar18 + lVar14 + uVar11;
            uVar12 = 1;
            do {
              if (0 < (int)uVar15) {
                uVar17 = 0;
                do {
                  piVar18[uVar17] = puVar4[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar11 != uVar17);
              }
              uVar12 = uVar12 + 1;
              piVar18 = piVar18 + uVar11;
            } while (uVar12 != uVar13);
            return puVar4;
          }
          return puVar4;
        }
      }
    }
    pcRes->nCubes = -1;
  }
  return (uint *)0x0;
}

Assistant:

unsigned * Kit_TruthIsop_rec( unsigned * puOn, unsigned * puOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned * puRes0, * puRes1, * puRes2;
    unsigned * puOn0, * puOn1, * puOnDc0, * puOnDc1, * pTemp, * pTemp0, * pTemp1;
    int i, k, Var, nWords, nWordsAll;
//    assert( Kit_TruthIsImply( puOn, puOnDc, nVars ) );
    // allocate room for the resulting truth table
    nWordsAll = Kit_TruthWordNum( nVars );
    pTemp = Vec_IntFetch( vStore, nWordsAll );
    if ( pTemp == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // check for constants
    if ( Kit_TruthIsConst0( puOn, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        Kit_TruthClear( pTemp, nVars );
        return pTemp;
    }
    if ( Kit_TruthIsConst1( puOnDc, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return NULL;
        }
        pcRes->pCubes[0] = 0;
        Kit_TruthFill( pTemp, nVars );
        return pTemp;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( puOn, nVars, Var ) || 
             Kit_TruthVarInSupport( puOnDc, nVars, Var ) )
             break;
    assert( Var >= 0 );
    // consider a simple case when one-word computation can be used
    if ( Var < 5 )
    {
        unsigned uRes = Kit_TruthIsop5_rec( puOn[0], puOnDc[0], Var+1, pcRes, vStore );
        for ( i = 0; i < nWordsAll; i++ )
            pTemp[i] = uRes;
        return pTemp;
    }
    assert( Var >= 5 );
    nWords = Kit_TruthWordNum( Var );
    // cofactor
    puOn0   = puOn;    puOn1   = puOn + nWords;
    puOnDc0 = puOnDc;  puOnDc1 = puOnDc + nWords;
    pTemp0  = pTemp;   pTemp1  = pTemp + nWords;
    // solve for cofactors
    Kit_TruthSharp( pTemp0, puOn0, puOnDc1, Var );
    puRes0 = Kit_TruthIsop_rec( pTemp0, puOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp1, puOn1, puOnDc0, Var );
    puRes1 = Kit_TruthIsop_rec( pTemp1, puOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp0, puOn0, puRes0, Var );
    Kit_TruthSharp( pTemp1, puOn1, puRes1, Var );
    Kit_TruthOr( pTemp0, pTemp0, pTemp1, Var );
    Kit_TruthAnd( pTemp1, puOnDc0, puOnDc1, Var );
    puRes2 = Kit_TruthIsop_rec( pTemp0, pTemp1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // create the resulting truth table
    Kit_TruthOr( pTemp0, puRes0, puRes2, Var );
    Kit_TruthOr( pTemp1, puRes1, puRes2, Var );
    // copy the table if needed
    nWords <<= 1;
    for ( i = 1; i < nWordsAll/nWords; i++ )
        for ( k = 0; k < nWords; k++ )
            pTemp[i*nWords + k] = pTemp[k];
    // verify in the end
//    assert( Kit_TruthIsImply( puOn, pTemp, nVars ) );
//    assert( Kit_TruthIsImply( pTemp, puOnDc, nVars ) );
    return pTemp;
}